

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core.hpp
# Opt level: O1

void __thiscall
iutest::detail::TestInstance<iu_PrintToTest_x_iutest_x_LongDouble_Test>::TestInstance
          (TestInstance<iu_PrintToTest_x_iutest_x_LongDouble_Test> *this,string *testsuite,
          char *name,TestTypeId id,SetUpMethod setup,TearDownMethod teardown)

{
  UnitTest *pUVar1;
  TestSuite *pTVar2;
  allocator<char> local_51;
  string local_50;
  
  pUVar1 = UnitTest::instance();
  pTVar2 = UnitTestImpl::AddTestSuite<iutest::TestSuite>
                     (&pUVar1->super_UnitTestImpl,testsuite,id,setup,teardown);
  (this->m_mediator).super_iuITestSuiteMediator.m_test_suite = pTVar2;
  (this->m_mediator).super_iuITestSuiteMediator._vptr_iuITestSuiteMediator =
       (_func_int **)&PTR__iuITestSuiteMediator_0015e358;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_51);
  TestInfo::TestInfo(&this->m_info,(iuITestSuiteMediator *)this,&local_50,
                     &(this->m_factory).super_iuFactoryBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_0015e598;
  pUVar1 = UnitTest::instance();
  pTVar2 = (this->m_mediator).super_iuITestSuiteMediator.m_test_suite;
  (pUVar1->super_UnitTestImpl).m_total_test_num = (pUVar1->super_UnitTestImpl).m_total_test_num + 1;
  TestSuite::push_back(pTVar2,&this->m_info);
  return;
}

Assistant:

TestInstance(const ::std::string& testsuite, const char* name, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown)
        : m_mediator(AddTestSuite(testsuite, id, setup, teardown))
        , m_info(&m_mediator, name, &m_factory)
    {
        UnitTest::instance().AddTestInfo(m_mediator.ptr(), &m_info);
    }